

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobjectbuilder.cpp
# Opt level: O0

QMetaMethodBuilder __thiscall
QMetaObjectBuilder::addMethod(QMetaObjectBuilder *this,QMetaMethod *prototype)

{
  MethodType MVar1;
  int __type;
  QMetaMethod *in_RSI;
  char *__name;
  long in_FS_OFFSET;
  QMetaMethodBuilder QVar2;
  QMetaMethodBuilder method;
  undefined4 in_stack_fffffffffffffdf8;
  Access in_stack_fffffffffffffdfc;
  QMetaMethodBuilder *in_stack_fffffffffffffe00;
  QMetaMethod *in_stack_fffffffffffffe08;
  QMetaMethod *in_stack_fffffffffffffe18;
  qsizetype in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  char *data;
  QByteArray *this_00;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  QMetaObjectBuilder *in_stack_fffffffffffffe48;
  char local_140 [24];
  char local_128 [24];
  QByteArray local_110;
  QMetaObjectBuilder *local_f8;
  int local_f0;
  QMetaObjectBuilder *local_d0;
  int local_c8;
  QMetaObjectBuilder *local_a8;
  int local_a0;
  QMetaObjectBuilder *local_80;
  int local_78;
  QMetaObjectBuilder *local_58;
  int local_50;
  QMetaObjectBuilder *local_48;
  int local_40;
  QMetaObjectBuilder *local_38;
  int local_30;
  QMetaObjectBuilder *local_28;
  int local_20;
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QMetaMethodBuilder::QMetaMethodBuilder((QMetaMethodBuilder *)local_18);
  MVar1 = QMetaMethod::methodType
                    ((QMetaMethod *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  if (MVar1 == Method) {
    QMetaMethod::methodSignature(in_stack_fffffffffffffe08);
    QVar2 = addMethod(in_stack_fffffffffffffe48,
                      (QByteArray *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    local_80 = QVar2._mobj;
    local_78 = QVar2._index;
    local_18._8_4_ = local_78;
    local_28 = local_80;
    local_20 = local_78;
    local_18._0_8_ = local_80;
    QByteArray::~QByteArray((QByteArray *)0x371817);
  }
  else {
    MVar1 = QMetaMethod::methodType
                      ((QMetaMethod *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8))
    ;
    if (MVar1 == Signal) {
      QMetaMethod::methodSignature(in_stack_fffffffffffffe08);
      QVar2 = addSignal(in_stack_fffffffffffffe48,
                        (QByteArray *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40))
      ;
      local_a8 = QVar2._mobj;
      local_a0 = QVar2._index;
      local_18._8_4_ = local_a0;
      local_38 = local_a8;
      local_30 = local_a0;
      local_18._0_8_ = local_a8;
      QByteArray::~QByteArray((QByteArray *)0x3718fa);
    }
    else {
      MVar1 = QMetaMethod::methodType
                        ((QMetaMethod *)
                         CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
      if (MVar1 == Slot) {
        QMetaMethod::methodSignature(in_stack_fffffffffffffe08);
        QVar2 = addSlot(in_stack_fffffffffffffe48,
                        (QByteArray *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40))
        ;
        local_d0 = QVar2._mobj;
        local_c8 = QVar2._index;
        local_18._8_4_ = local_c8;
        local_48 = local_d0;
        local_40 = local_c8;
        local_18._0_8_ = local_d0;
        QByteArray::~QByteArray((QByteArray *)0x3719d7);
      }
      else {
        MVar1 = QMetaMethod::methodType
                          ((QMetaMethod *)
                           CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
        if (MVar1 == Constructor) {
          QMetaMethod::methodSignature(in_stack_fffffffffffffe08);
          QVar2 = addConstructor(in_stack_fffffffffffffe48,
                                 (QByteArray *)
                                 CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
          local_f8 = QVar2._mobj;
          local_f0 = QVar2._index;
          local_18._8_4_ = local_f0;
          local_58 = local_f8;
          local_50 = local_f0;
          local_18._0_8_ = local_f8;
          QByteArray::~QByteArray((QByteArray *)0x371ab4);
        }
      }
    }
  }
  QMetaMethod::typeName
            ((QMetaMethod *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  this_00 = &local_110;
  QByteArray::QByteArray(this_00,in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
  QMetaMethodBuilder::setReturnType
            (in_stack_fffffffffffffe00,
             (QByteArray *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  QByteArray::~QByteArray((QByteArray *)0x371b30);
  data = local_128;
  QMetaMethod::parameterNames(in_stack_fffffffffffffe08);
  QMetaMethodBuilder::setParameterNames
            (in_stack_fffffffffffffe00,
             (QList<QByteArray> *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  QList<QByteArray>::~QList((QList<QByteArray> *)0x371b6b);
  QMetaMethod::tag((QMetaMethod *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  __name = local_140;
  QByteArray::QByteArray(this_00,data,(qsizetype)__name);
  QMetaMethodBuilder::setTag
            (in_stack_fffffffffffffe00,
             (QByteArray *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  QByteArray::~QByteArray((QByteArray *)0x371bb5);
  QMetaMethod::access(in_RSI,__name,__type);
  QMetaMethodBuilder::setAccess(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  QMetaMethod::attributes
            ((QMetaMethod *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8));
  QMetaMethodBuilder::setAttributes(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  QMetaMethod::revision(in_stack_fffffffffffffe18);
  QMetaMethodBuilder::setRevision(in_stack_fffffffffffffe00,in_stack_fffffffffffffdfc);
  QMetaMethod::isConst((QMetaMethod *)CONCAT44(in_stack_fffffffffffffdfc,in_stack_fffffffffffffdf8))
  ;
  QMetaMethodBuilder::setConst(in_stack_fffffffffffffe00,SUB41(in_stack_fffffffffffffdfc >> 0x18,0))
  ;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  QVar2._index = local_18._8_4_;
  QVar2._mobj = (QMetaObjectBuilder *)local_18._0_8_;
  QVar2._12_4_ = 0;
  return QVar2;
}

Assistant:

QMetaMethodBuilder QMetaObjectBuilder::addMethod(const QMetaMethod &prototype)
{
    QMetaMethodBuilder method;
    if (prototype.methodType() == QMetaMethod::Method)
        method = addMethod(prototype.methodSignature());
    else if (prototype.methodType() == QMetaMethod::Signal)
        method = addSignal(prototype.methodSignature());
    else if (prototype.methodType() == QMetaMethod::Slot)
        method = addSlot(prototype.methodSignature());
    else if (prototype.methodType() == QMetaMethod::Constructor)
        method = addConstructor(prototype.methodSignature());
    method.setReturnType(prototype.typeName());
    method.setParameterNames(prototype.parameterNames());
    method.setTag(prototype.tag());
    method.setAccess(prototype.access());
    method.setAttributes(prototype.attributes());
    method.setRevision(prototype.revision());
    method.setConst(prototype.isConst());
    return method;
}